

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::OgreXmlSerializer::ReadSubMesh(OgreXmlSerializer *this,MeshXml *mesh)

{
  bool bVar1;
  uint32_t uVar2;
  SubMeshXml *this_00;
  Logger *pLVar3;
  basic_formatter *pbVar4;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  DeadlyImportError *pDVar6;
  VertexDataXml *this_01;
  size_type sVar7;
  bool local_909;
  allocator<char> local_8a1;
  string local_8a0;
  undefined1 local_879;
  size_type local_878;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  string local_6f8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  string local_560;
  undefined1 local_540 [8];
  aiFace face;
  char *pcStack_528;
  bool quadWarned;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_3a8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_210;
  size_type local_1f0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_70;
  string local_50;
  SubMeshXml *local_20;
  SubMeshXml *submesh;
  MeshXml *mesh_local;
  OgreXmlSerializer *this_local;
  
  submesh = (SubMeshXml *)mesh;
  mesh_local = (MeshXml *)this;
  this_00 = (SubMeshXml *)operator_new(0xa8);
  SubMeshXml::SubMeshXml(this_00);
  local_20 = this_00;
  bVar1 = HasAttribute(this,ReadSubMesh::anMaterial);
  if (bVar1) {
    ReadAttribute<std::__cxx11::string>(&local_50,this,ReadSubMesh::anMaterial);
    std::__cxx11::string::operator=
              ((string *)&(local_20->super_ISubMesh).materialRef,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  bVar1 = HasAttribute(this,ReadSubMesh::anUseSharedVertices);
  if (bVar1) {
    bVar1 = ReadAttribute<bool>(this,ReadSubMesh::anUseSharedVertices);
    (local_20->super_ISubMesh).usesSharedVertexData = bVar1;
  }
  pLVar3 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[17]>(&local_1e8,(char (*) [17])"Reading SubMesh ");
  local_1f0 = std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::
              size((vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                    *)&(submesh->super_ISubMesh).materialRef._M_string_length);
  pbVar4 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_1e8,&local_1f0);
  Formatter::basic_formatter::operator_cast_to_string(&local_70,pbVar4);
  Logger::debug(pLVar3,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1e8);
  pLVar3 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[16]>(&local_388,(char (*) [16])"  - Material: \'");
  pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_388,&(local_20->super_ISubMesh).materialRef);
  pbVar4 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar5,(char (*) [2])0xb4d897);
  Formatter::basic_formatter::operator_cast_to_string(&local_210,pbVar4);
  Logger::debug(pLVar3,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_388);
  pLVar3 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>(&local_520,(char (*) [27])"  - Uses shared geometry: ");
  pcStack_528 = "false";
  if (((local_20->super_ISubMesh).usesSharedVertexData & 1U) != 0) {
    pcStack_528 = "true";
  }
  pbVar4 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_520,&stack0xfffffffffffffad8);
  Formatter::basic_formatter::operator_cast_to_string(&local_3a8,pbVar4);
  Logger::debug(pLVar3,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_520);
  face.mIndices._7_1_ = 0;
  NextNode_abi_cxx11_(this);
  while( true ) {
    while( true ) {
      bVar1 = std::operator==(&this->m_currentNodeName,nnFaces);
      local_909 = true;
      if (!bVar1) {
        bVar1 = std::operator==(&this->m_currentNodeName,nnGeometry);
        local_909 = true;
        if (!bVar1) {
          bVar1 = std::operator==(&this->m_currentNodeName,nnTextures);
          local_909 = true;
          if (!bVar1) {
            local_909 = std::operator==(&this->m_currentNodeName,nnBoneAssignments);
          }
        }
      }
      if (local_909 == false) {
        sVar7 = std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                ::size((vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                        *)&(submesh->super_ISubMesh).materialRef._M_string_length);
        (local_20->super_ISubMesh).index = (uint)sVar7;
        std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::
        push_back((vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_> *
                  )&(submesh->super_ISubMesh).materialRef._M_string_length,&local_20);
        return;
      }
      bVar1 = std::operator==(&this->m_currentNodeName,nnFaces);
      if (bVar1) break;
      bVar1 = std::operator==(&this->m_currentNodeName,nnGeometry);
      if (bVar1) {
        if (((local_20->super_ISubMesh).usesSharedVertexData & 1U) != 0) {
          pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a0,
                     "Found <geometry> in <submesh> when use shared geometry is true. Invalid mesh file."
                     ,&local_8a1);
          DeadlyImportError::DeadlyImportError(pDVar6,&local_8a0);
          __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        this_01 = (VertexDataXml *)operator_new(0xe0);
        VertexDataXml::VertexDataXml(this_01);
        local_20->vertexData = this_01;
        ReadGeometry(this,local_20->vertexData);
      }
      else {
        bVar1 = std::operator==(&this->m_currentNodeName,nnBoneAssignments);
        if (bVar1) {
          ReadBoneAssignments(this,local_20->vertexData);
        }
        else {
          SkipCurrentNode_abi_cxx11_(this);
        }
      }
    }
    uVar2 = ReadAttribute<unsigned_int>(this,ReadSubMesh::anCount);
    local_20->indexData->faceCount = uVar2;
    std::vector<aiFace,_std::allocator<aiFace>_>::reserve
              (&local_20->indexData->faces,(ulong)local_20->indexData->faceCount);
    NextNode_abi_cxx11_(this);
    while (bVar1 = std::operator==(&this->m_currentNodeName,nnFace), bVar1) {
      aiFace::aiFace((aiFace *)local_540);
      local_540._0_4_ = 3;
      face._0_8_ = operator_new__(0xc);
      uVar2 = ReadAttribute<unsigned_int>(this,ReadSubMesh::anV1);
      *(uint32_t *)face._0_8_ = uVar2;
      uVar2 = ReadAttribute<unsigned_int>(this,ReadSubMesh::anV2);
      *(uint32_t *)(face._0_8_ + 4) = uVar2;
      uVar2 = ReadAttribute<unsigned_int>(this,ReadSubMesh::anV3);
      *(uint32_t *)(face._0_8_ + 8) = uVar2;
      if (((face.mIndices._7_1_ & 1) == 0) && (bVar1 = HasAttribute(this,ReadSubMesh::anV4), bVar1))
      {
        pLVar3 = DefaultLogger::get();
        Logger::warn(pLVar3,
                     "Submesh <face> has quads with <v4>, only triangles are supported at the moment!"
                    );
        face.mIndices._7_1_ = 1;
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                (&local_20->indexData->faces,(value_type *)local_540);
      NextNode_abi_cxx11_(this);
      aiFace::~aiFace((aiFace *)local_540);
    }
    sVar7 = std::vector<aiFace,_std::allocator<aiFace>_>::size(&local_20->indexData->faces);
    if (sVar7 != local_20->indexData->faceCount) break;
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[11]>(&local_6d8,(char (*) [11])"  - Faces ");
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_6d8,&local_20->indexData->faceCount);
    Formatter::basic_formatter::operator_cast_to_string(&local_560,pbVar4);
    Logger::debug(pLVar3,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_6d8);
  }
  local_879 = 1;
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            (&local_870);
  pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_870,(char (*) [11])"Read only ");
  local_878 = std::vector<aiFace,_std::allocator<aiFace>_>::size(&local_20->indexData->faces);
  pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar5,&local_878);
  pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar5,(char (*) [30])" faces when should have read ");
  pbVar4 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar5,&local_20->indexData->faceCount);
  Formatter::basic_formatter::operator_cast_to_string(&local_6f8,pbVar4);
  DeadlyImportError::DeadlyImportError(pDVar6,&local_6f8);
  local_879 = 0;
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OgreXmlSerializer::ReadSubMesh(MeshXml *mesh)
{
    static const char *anMaterial          = "material";
    static const char *anUseSharedVertices = "usesharedvertices";
    static const char *anCount             = "count";
    static const char *anV1                = "v1";
    static const char *anV2                = "v2";
    static const char *anV3                = "v3";
    static const char *anV4                = "v4";

    SubMeshXml* submesh = new SubMeshXml();

    if (HasAttribute(anMaterial)) {
        submesh->materialRef = ReadAttribute<std::string>(anMaterial);
    }
    if (HasAttribute(anUseSharedVertices)) {
        submesh->usesSharedVertexData = ReadAttribute<bool>(anUseSharedVertices);
    }

    ASSIMP_LOG_DEBUG_F( "Reading SubMesh ", mesh->subMeshes.size());
    ASSIMP_LOG_DEBUG_F( "  - Material: '", submesh->materialRef, "'");
    ASSIMP_LOG_DEBUG_F( "  - Uses shared geometry: ", (submesh->usesSharedVertexData ? "true" : "false"));

    // TODO: maybe we have always just 1 faces and 1 geometry and always in this order. this loop will only work correct, when the order
    // of faces and geometry changed, and not if we have more than one of one
    /// @todo Fix above comment with better read logic below

    bool quadWarned = false;

    NextNode();
    while(m_currentNodeName == nnFaces     ||
          m_currentNodeName == nnGeometry  ||
          m_currentNodeName == nnTextures  ||
          m_currentNodeName == nnBoneAssignments)
    {
        if (m_currentNodeName == nnFaces)
        {
            submesh->indexData->faceCount = ReadAttribute<uint32_t>(anCount);
            submesh->indexData->faces.reserve(submesh->indexData->faceCount);

            NextNode();
            while(m_currentNodeName == nnFace)
            {
                aiFace face;
                face.mNumIndices = 3;
                face.mIndices = new unsigned int[3];
                face.mIndices[0] = ReadAttribute<uint32_t>(anV1);
                face.mIndices[1] = ReadAttribute<uint32_t>(anV2);
                face.mIndices[2] = ReadAttribute<uint32_t>(anV3);

                /// @todo Support quads if Ogre even supports them in XML (I'm not sure but I doubt it)
                if (!quadWarned && HasAttribute(anV4)) {
                    ASSIMP_LOG_WARN("Submesh <face> has quads with <v4>, only triangles are supported at the moment!");
                    quadWarned = true;
                }

                submesh->indexData->faces.push_back(face);

                // Advance
                NextNode();
            }

            if (submesh->indexData->faces.size() == submesh->indexData->faceCount) {
                ASSIMP_LOG_DEBUG_F( "  - Faces ", submesh->indexData->faceCount);
            } else {
                throw DeadlyImportError(Formatter::format() << "Read only " << submesh->indexData->faces.size() << " faces when should have read " << submesh->indexData->faceCount);
            }
        } else if (m_currentNodeName == nnGeometry) {
            if (submesh->usesSharedVertexData) {
                throw DeadlyImportError("Found <geometry> in <submesh> when use shared geometry is true. Invalid mesh file.");
            }

            submesh->vertexData = new VertexDataXml();
            ReadGeometry(submesh->vertexData);
        } else if (m_currentNodeName == nnBoneAssignments) {
            ReadBoneAssignments(submesh->vertexData);
        }
        // Assimp incompatible/ignored nodes
        else {
            SkipCurrentNode();
        }
    }

    submesh->index = static_cast<unsigned int>(mesh->subMeshes.size());
    mesh->subMeshes.push_back(submesh);
}